

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_4e1;
  string str;
  Format mainFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488;
  string local_468;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  CppLogger errorLogger;
  CppLogger mainLogger;
  
  CppLogger::CppLogger::CppLogger(&mainLogger,Trace,"Main",false);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"Test",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printTrace(&mainLogger,local_308);
  std::__cxx11::string::~string(local_308);
  _errorLogger = 2;
  CppLogger::Format::Format(&mainFormat,&errorLogger,4);
  CppLogger::CppLogger::setFormat((Format *)&mainLogger);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"Main",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printTrace(&mainLogger,local_328);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"Main",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printInfo(&mainLogger,local_348);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"Main",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printWarn(&mainLogger,local_368);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"Main",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printError(&mainLogger,local_388);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"Main",(allocator<char> *)&errorLogger);
  CppLogger::CppLogger::printFatalError(&mainLogger,local_3a8);
  std::__cxx11::string::~string(local_3a8);
  CppLogger::CppLogger::CppLogger(&errorLogger,Trace,"Error logger",false);
  CppLogger::CppLogger::setFormat((Format *)&errorLogger);
  CppLogger::CppLogger::setOStream((ostream *)&errorLogger);
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"Error",(allocator<char> *)&str);
  CppLogger::CppLogger::printTrace(&errorLogger,local_3c8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"Error",(allocator<char> *)&str);
  CppLogger::CppLogger::printInfo(&errorLogger,local_3e8);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::string<std::allocator<char>>(local_408,"Error",(allocator<char> *)&str);
  CppLogger::CppLogger::printWarn(&errorLogger,local_408);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::string<std::allocator<char>>(local_428,"Error",(allocator<char> *)&str);
  CppLogger::CppLogger::printError(&errorLogger,local_428);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::string<std::allocator<char>>(local_448,"Error",(allocator<char> *)&str);
  CppLogger::CppLogger::printFatalError(&errorLogger,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::string<std::allocator<char>>((string *)&str,"I shall be logged",&local_4e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"Printing a:{}, and b: {}, but not f;",&local_4e1);
  CppLogger::CppLogger::printTrace<int,char,float>(&errorLogger,&local_468,5,'b',5.4);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"{}",&local_4e1);
  std::__cxx11::string::string((string *)&local_4a8,&str);
  CppLogger::CppLogger::printWarn<std::__cxx11::string>(&errorLogger,&local_488,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&str);
  CppLogger::CppLogger::~CppLogger(&errorLogger);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base((_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                 *)&mainFormat);
  CppLogger::CppLogger::~CppLogger(&mainLogger);
  return 0;
}

Assistant:

int main() {
    // Creating a logger (the last parameter is false by default and 
    //  if is set to true it will exit after a printFatalError())
    CppLogger::CppLogger mainLogger(CppLogger::Level::Trace, "Main"/*, true*/);

    // Trace level log
    mainLogger.printTrace("Test");

    // Create a format for your logger (the order of the format is respected)
    CppLogger::Format mainFormat({
            CppLogger::FormatAttribute::Time,
            CppLogger::FormatAttribute::Name,
            CppLogger::FormatAttribute::Level,
            CppLogger::FormatAttribute::Message
            });

    // Apply the format to your logger
    mainLogger.setFormat(mainFormat);

    // Different levels of logging
    mainLogger.printTrace("Main");
    mainLogger.printInfo("Main");
    mainLogger.printWarn("Main");
    mainLogger.printError("Main");
    mainLogger.printFatalError("Main");

    CppLogger::CppLogger errorLogger(CppLogger::Level::Trace, "Error logger");

    errorLogger.setFormat(mainFormat);

    errorLogger.setOStream(std::cerr);

    errorLogger.printTrace("Error");
    errorLogger.printInfo("Error");
    errorLogger.printWarn("Error");
    errorLogger.printError("Error");
    errorLogger.printFatalError("Error");

    int a = 5;
    char b = 'b';
    std::string str = "I shall be logged";
    float f = 5.4f;

    errorLogger.printTrace("Printing a:{}, and b: {}, but not f;", a, b, f);
    errorLogger.printWarn("{}", str);
}